

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O2

bool __thiscall r_exec::HLPContext::operator==(HLPContext *this,HLPContext *c)

{
  char cVar1;
  bool bVar2;
  uint16_t uVar3;
  bool bVar4;
  uint16_t i;
  ushort uVar5;
  HLPContext lhs;
  HLPContext rhs;
  HLPContext local_f0;
  HLPContext local_d0;
  HLPContext local_b0;
  HLPContext local_90;
  HLPContext local_70;
  HLPContext local_50;
  
  operator*(&local_f0,this);
  operator*(&local_d0,c);
  cVar1 = r_code::Atom::operator!=
                    (local_f0.super__Context.code + (ulong)local_f0.super__Context.index * 4,
                     local_d0.super__Context.code + (ulong)local_d0.super__Context.index * 4);
  if (cVar1 == '\0') {
    cVar1 = r_code::Atom::isStructural();
    bVar4 = true;
    if (cVar1 != '\0') {
      uVar3 = getChildrenCount(&local_f0);
      uVar5 = 1;
      do {
        bVar4 = uVar3 < uVar5;
        if (uVar3 < uVar5) {
          return bVar4;
        }
        HLPContext(&local_70,local_f0.super__Context.code,local_f0.super__Context.index + uVar5,
                   (HLPOverlay *)local_f0.super__Context.overlay,STEM);
        operator*(&local_50,&local_70);
        HLPContext(&local_b0,local_d0.super__Context.code,uVar5 + local_d0.super__Context.index,
                   (HLPOverlay *)local_d0.super__Context.overlay,STEM);
        operator*(&local_90,&local_b0);
        bVar2 = operator!=(&local_50,&local_90);
        uVar5 = uVar5 + 1;
      } while (!bVar2);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool HLPContext::operator ==(const HLPContext &c) const
{
    HLPContext lhs = **this;
    HLPContext rhs = *c;

    if (lhs[0] != rhs[0]) { // both contexts point to an atom which is not a pointer.
        return false;
    }

    if (lhs[0].isStructural()) { // both are structural.
        uint16_t atom_count = lhs.getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i)
            if (*lhs.getChild(i) != *rhs.getChild(i)) {
                return false;
            }

        return true;
    }

    return true;
}